

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bech32_error bech32_encode(bech32_bstring *bstring,char *hrp,uchar *dp,size_t dplen)

{
  size_t sVar1;
  ulong uVar2;
  bech32_error bVar3;
  string b;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dpVec;
  string hrpStr;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  string local_70;
  string local_50;
  
  bVar3 = E_BECH32_NULL_ARGUMENT;
  if (dp != (uchar *)0x0 && (hrp != (char *)0x0 && bstring != (bech32_bstring *)0x0)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar1 = strlen(hrp);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,hrp,hrp + sVar1);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,dp,dp + dplen,
               (allocator_type *)&local_a8);
    local_a0 = 0;
    local_98 = 0;
    local_a8 = &local_98;
    bech32::encodeBasis(&local_50,&local_70,&local_88,anon_unknown.dwarf_41511::createChecksum);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar3 = E_BECH32_LENGTH_TOO_SHORT;
    if (local_a0 <= bstring->length) {
      bVar3 = E_BECH32_SUCCESS;
      if (local_a0 == 0) {
        uVar2 = 0;
      }
      else {
        memmove(bstring->string,local_a8,local_a0);
        uVar2 = local_a0;
      }
      bstring->string[uVar2] = '\0';
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

bech32_error bech32_encode(
        bech32_bstring *bstring,
        const char *hrp,
        const unsigned char *dp, size_t dplen) {

    if(bstring == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string hrpStr(hrp);
    std::vector<unsigned char> dpVec(dp, dp + dplen);

    std::string b;
    try {
        b = bech32::encode(hrpStr, dpVec);
    }
    catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }
    if(b.size() > bstring->length)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(b.begin(), b.size(), bstring->string);
    bstring->string[b.size()] = '\0';

    return E_BECH32_SUCCESS;
}